

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::Promise<void_*>_> * __thiscall
kj::_::NullableValue<kj::Promise<void_*>_>::operator=
          (NullableValue<kj::Promise<void_*>_> *this,NullableValue<kj::Promise<void_*>_> *other)

{
  PromiseNode *pPVar1;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&(this->field_1).value);
    }
    if (other->isSet == true) {
      pPVar1 = (other->field_1).value.super_PromiseBase.node.ptr;
      (this->field_1).value.super_PromiseBase.node.disposer =
           (other->field_1).value.super_PromiseBase.node.disposer;
      (this->field_1).value.super_PromiseBase.node.ptr = pPVar1;
      (other->field_1).value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }